

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegAtomPush(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  int iVar1;
  xmlRegAtomPtr *ppxVar2;
  int newSize;
  xmlRegAtomPtr *tmp;
  xmlRegAtomPtr atom_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"atom push: atom is NULL");
    return -1;
  }
  if (ctxt->maxAtoms <= ctxt->nbAtoms) {
    iVar1 = xmlGrowCapacity(ctxt->maxAtoms,8,4,1000000000);
    if (iVar1 < 0) {
      xmlRegexpErrMemory(ctxt);
      return -1;
    }
    ppxVar2 = (xmlRegAtomPtr *)(*xmlRealloc)(ctxt->atoms,(long)iVar1 << 3);
    if (ppxVar2 == (xmlRegAtomPtr *)0x0) {
      xmlRegexpErrMemory(ctxt);
      return -1;
    }
    ctxt->atoms = ppxVar2;
    ctxt->maxAtoms = iVar1;
  }
  atom->no = ctxt->nbAtoms;
  iVar1 = ctxt->nbAtoms;
  ctxt->nbAtoms = iVar1 + 1;
  ctxt->atoms[iVar1] = atom;
  return 0;
}

Assistant:

static int
xmlRegAtomPush(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    if (atom == NULL) {
	ERROR("atom push: atom is NULL");
	return(-1);
    }
    if (ctxt->nbAtoms >= ctxt->maxAtoms) {
	xmlRegAtomPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxAtoms, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->atoms, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->atoms = tmp;
        ctxt->maxAtoms = newSize;
    }
    atom->no = ctxt->nbAtoms;
    ctxt->atoms[ctxt->nbAtoms++] = atom;
    return(0);
}